

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip_zip64.c
# Opt level: O2

void test_read_format_zip_zip64a(void)

{
  wchar_t wVar1;
  int iVar2;
  char *buff;
  archive *paVar3;
  size_t s;
  
  extract_reference_file("test_read_format_zip_zip64a.zip");
  buff = slurpfile(&s,"test_read_format_zip_zip64a.zip");
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                   ,L'^',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  wVar1 = archive_read_support_format_zip_seekable(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L'_',0,"ARCHIVE_OK",(long)wVar1,"archive_read_support_format_zip_seekable(a)"
                      ,paVar3);
  iVar2 = read_open_memory_seek(paVar3,buff,s,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L'`',0,"ARCHIVE_OK",(long)iVar2,"read_open_memory_seek(a, p, s, 1)",paVar3);
  verify_file0_seek(paVar3);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                   ,L'd',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  wVar1 = archive_read_support_format_zip_streamable(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L'e',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_read_support_format_zip_streamable(a)",paVar3);
  iVar2 = read_open_memory_seek(paVar3,buff,s,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L'f',0,"ARCHIVE_OK",(long)iVar2,"read_open_memory_seek(a, p, s, 1)",paVar3);
  verify_file0_stream(paVar3,0);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_zip64a)
{
	const char *refname = "test_read_format_zip_zip64a.zip";
	struct archive *a;
	char *p;
	size_t s;

	extract_reference_file(refname);
	p = slurpfile(&s, refname);

	/* First read with seeking. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip_seekable(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, p, s, 1));
	verify_file0_seek(a);

	/* Then read streaming. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip_streamable(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, p, s, 1));
	verify_file0_stream(a, 0);
	free(p);
}